

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::find_lower(StringRef *this,StringRef Str,size_t From)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  StringRef local_40;
  
  uVar3 = this->Length;
  sVar2 = From;
  if (uVar3 < From) {
    sVar2 = uVar3;
  }
  uVar3 = uVar3 - sVar2;
  local_40.Data = this->Data + sVar2;
  while( true ) {
    pcVar4 = local_40.Data + 1;
    if (uVar3 < Str.Length) {
      return 0xffffffffffffffff;
    }
    local_40.Length = uVar3;
    bVar1 = startswith_lower(&local_40,Str);
    if (bVar1) break;
    bVar1 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar1) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    From = From + 1;
    local_40.Data = pcVar4;
  }
  return From;
}

Assistant:

size_t StringRef::find_lower(StringRef Str, size_t From) const {
  StringRef This = substr(From);
  while (This.size() >= Str.size()) {
    if (This.startswith_lower(Str))
      return From;
    This = This.drop_front();
    ++From;
  }
  return npos;
}